

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowsReporters.cpp
# Opt level: O2

void __thiscall
ApprovalTests::Windows::TortoiseTextDiffReporter::TortoiseTextDiffReporter
          (TortoiseTextDiffReporter *this)

{
  DiffInfo DStack_58;
  
  DiffPrograms::Windows::TORTOISE_TEXT_DIFF();
  GenericDiffReporter::GenericDiffReporter(&this->super_GenericDiffReporter,&DStack_58);
  DiffInfo::~DiffInfo(&DStack_58);
  (this->super_GenericDiffReporter).super_CommandReporter.super_Reporter._vptr_Reporter =
       (_func_int **)&PTR__GenericDiffReporter_0013e160;
  return;
}

Assistant:

TortoiseTextDiffReporter::TortoiseTextDiffReporter()
            : GenericDiffReporter(DiffPrograms::Windows::TORTOISE_TEXT_DIFF())
        {
        }